

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles3::Performance::anon_unknown_1::UploadWaitDrawCase::iterate(UploadWaitDrawCase *this)

{
  TargetBuffer TVar1;
  UploadMethod UVar2;
  pointer pSVar3;
  RenderContext *context;
  TestLog *pTVar4;
  pointer piVar5;
  TestContext *this_00;
  char cVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  int iVar11;
  int iVar12;
  deUint32 dVar13;
  int iVar14;
  IterateResult IVar15;
  undefined4 extraout_var;
  deUint64 dVar16;
  deUint64 dVar17;
  deUint64 dVar18;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  void *__dest;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  SampleBuilder *pSVar19;
  Exception *this_01;
  undefined8 *puVar20;
  long lVar21;
  ulong uVar22;
  ulong __n;
  string *psVar23;
  LogValueInfo *pLVar24;
  long lVar25;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *__buf_04;
  void *__buf_05;
  void *__buf_06;
  void *__buf_07;
  void *__buf_08;
  void *__buf_09;
  void *__buf_10;
  long lVar26;
  ulong uVar27;
  undefined4 uVar28;
  undefined8 uVar29;
  long lVar30;
  pointer pRVar31;
  float local_878;
  allocator<char> local_86a;
  allocator<char> local_869;
  allocator<char> local_868;
  allocator<char> local_867;
  allocator<char> local_866;
  allocator<char> local_865;
  allocator<char> local_864;
  allocator<char> local_863;
  allocator<char> local_862;
  allocator<char> local_861;
  allocator<char> local_860;
  allocator<char> local_85f;
  allocator<char> local_85e;
  allocator<char> local_85d;
  allocator<char> local_85c;
  allocator<char> local_85b;
  allocator<char> local_85a;
  allocator<char> local_859;
  allocator<char> local_858;
  allocator<char> local_857;
  allocator<char> local_856;
  allocator<char> local_855;
  allocator<char> local_854;
  allocator<char> local_853;
  allocator<char> local_852;
  allocator<char> local_851;
  long local_850;
  long local_848;
  void *local_840;
  int renderReadStabilization;
  ScopedLogSection section;
  Surface resultSurface;
  vector<int,_std::allocator<int>_> runOrder;
  ScopedLogSection section_1;
  LogValueInfo local_738;
  undefined1 local_6d0 [8];
  undefined1 local_6c8 [376];
  string local_550;
  string local_530;
  string local_510;
  string local_4f0;
  string local_4d0;
  string local_4b0;
  string local_490;
  string local_470;
  string local_450;
  string local_430;
  string local_410;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  ScopedLogSection section_2;
  LogValueInfo local_1a8;
  LogValueInfo local_140;
  LogValueInfo local_d8;
  LogSampleList local_70;
  
  iVar11 = (*((this->super_RenderPerformanceTestBase).super_TestCase.m_context)->m_renderCtx->
             _vptr_RenderContext[3])();
  local_848 = CONCAT44(extraout_var,iVar11);
  iVar11 = this->m_frameNdx;
  this->m_frameNdx = iVar11 + 1;
  local_850 = (long)(this->m_iterationOrder).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[this->m_sampleNdx];
  dVar16 = deGetMicroseconds();
  local_878 = *tcu::warmupCPUInternal::g_dummy;
  iVar12 = 500;
  do {
    iVar14 = iVar12;
    dVar17 = deGetMicroseconds();
    if (dVar16 + 8000 <= dVar17) break;
    dVar17 = deGetMicroseconds();
    local_878 = dummyCalculation(local_878,iVar14);
    dVar18 = deGetMicroseconds();
    iVar12 = iVar14 * 2;
  } while (dVar18 - dVar17 < 1000);
  while (dVar17 = deGetMicroseconds(), lVar26 = local_850, dVar17 < dVar16 + 8000) {
    local_878 = dummyCalculation(local_878,iVar14);
  }
  *tcu::warmupCPUInternal::g_dummy = local_878;
  if (iVar11 != (this->m_samples).
                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample>_>
                ._M_impl.super__Vector_impl_data._M_start[local_850].numFrames) {
    iVar12 = (*((this->super_RenderPerformanceTestBase).super_TestCase.m_context)->m_renderCtx->
               _vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var_00,iVar12) + 0x40))(0x8892,this->m_miscBuffer);
    RenderPerformanceTestBase::setupVertexAttribs(&this->super_RenderPerformanceTestBase);
    (**(code **)(CONCAT44(extraout_var_00,iVar12) + 0x538))(4,0,this->m_numMiscVertices);
  }
  if (iVar11 == 0) {
    pSVar3 = (this->m_samples).
             super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pRVar31 = (this->m_results).
              super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Result,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Result>_>
              ._M_impl.super__Vector_impl_data._M_start + local_850;
    iVar12 = (*((this->super_RenderPerformanceTestBase).super_TestCase.m_context)->m_renderCtx->
               _vptr_RenderContext[3])();
    lVar30 = CONCAT44(extraout_var_01,iVar12);
    TVar1 = this->m_targetBuffer;
    if (TVar1 == TARGETBUFFER_VERTEX) {
      uVar28 = 0x8892;
      lVar21 = 0xb8;
      lVar25 = 0xb0;
    }
    else {
      if (TVar1 != TARGETBUFFER_INDEX) goto LAB_011978cc;
      uVar28 = 0x8893;
      lVar21 = 0xd0;
      lVar25 = 200;
    }
    local_840 = *(void **)((long)&(this->super_RenderPerformanceTestBase).super_TestCase.
                                  super_TestCase.super_TestNode._vptr_TestNode + lVar25);
    lVar21 = *(long *)((long)&(this->super_RenderPerformanceTestBase).super_TestCase.super_TestCase.
                              super_TestNode._vptr_TestNode + lVar21) - (long)local_840;
    if (this->m_bufferState == BUFFERSTATE_EXISTING) {
      if (TVar1 == TARGETBUFFER_VERTEX) {
        dVar13 = this->m_vertexBuffer;
        uVar29 = 0x8892;
      }
      else {
        dVar13 = this->m_indexBuffer;
        uVar29 = 0x8893;
      }
      (**(code **)(lVar30 + 0x40))(uVar29,dVar13);
    }
    else if (this->m_bufferState == BUFFERSTATE_NEW) {
      if (TVar1 == TARGETBUFFER_VERTEX) {
        (**(code **)(lVar30 + 0x6c8))(1,&this->m_vertexBuffer);
        dVar13 = this->m_vertexBuffer;
        uVar29 = 0x8892;
      }
      else {
        (**(code **)(lVar30 + 0x6c8))(1,&this->m_indexBuffer);
        dVar13 = this->m_indexBuffer;
        uVar29 = 0x8893;
      }
      (**(code **)(lVar30 + 0x40))(uVar29,dVar13);
      if (this->m_uploadMethod - UPLOADMETHOD_BUFFER_SUB_DATA < 2) {
        (**(code **)(lVar30 + 0x150))(uVar28,lVar21,0,0x88e4);
      }
    }
    dVar16 = deGetMicroseconds();
    UVar2 = this->m_uploadMethod;
    if (UVar2 == UPLOADMETHOD_MAP_BUFFER_RANGE) {
      __dest = (void *)(**(code **)(lVar30 + 0xd00))(uVar28,0,lVar21,0x2a);
      if (__dest == (void *)0x0) {
        this_01 = (Exception *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_6d0,"MapBufferRange returned NULL",
                   (allocator<char> *)&resultSurface);
        tcu::Exception::Exception(this_01,(string *)local_6d0);
        __cxa_throw(this_01,&tcu::Exception::typeinfo,tcu::Exception::~Exception);
      }
      memcpy(__dest,local_840,(long)(int)lVar21);
      cVar6 = (**(code **)(lVar30 + 0x1670))(uVar28);
      if (cVar6 == '\0') {
        puVar20 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar20 = &PTR__exception_01e4a2b8;
        __cxa_throw(puVar20,&Performance::(anonymous_namespace)::UnmapFailureError::typeinfo,
                    std::exception::~exception);
      }
    }
    else if (UVar2 == UPLOADMETHOD_BUFFER_SUB_DATA) {
      (**(code **)(lVar30 + 0x168))(uVar28,0,lVar21,local_840);
    }
    else if (UVar2 == UPLOADMETHOD_BUFFER_DATA) {
      (**(code **)(lVar30 + 0x150))(uVar28,lVar21,local_840,0x88e4);
    }
    dVar17 = deGetMicroseconds();
    pSVar3[lVar26].uploadCallEndTime = dVar17;
    pRVar31->uploadDuration = dVar17 - dVar16;
  }
LAB_011978cc:
  lVar30 = local_850;
  pSVar3 = (this->m_samples).
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample>_>
           ._M_impl.super__Vector_impl_data._M_start;
  iVar12 = pSVar3[lVar26].numFrames;
  if (iVar11 == iVar12) {
    pRVar31 = (this->m_results).
              super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Result,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Result>_>
              ._M_impl.super__Vector_impl_data._M_start;
    iVar11 = (*((this->super_RenderPerformanceTestBase).super_TestCase.m_context)->m_renderCtx->
               _vptr_RenderContext[3])();
    lVar21 = CONCAT44(extraout_var_02,iVar11);
    tcu::Surface::Surface(&resultSurface,0x80,0x80);
    (**(code **)(lVar21 + 0x40))(0x8892,this->m_vertexBuffer);
    if (this->m_drawMethod == DRAWMETHOD_DRAW_ELEMENTS) {
      (**(code **)(lVar21 + 0x40))(0x8893,this->m_indexBuffer);
    }
    RenderPerformanceTestBase::setupVertexAttribs(&this->super_RenderPerformanceTestBase);
    dVar16 = deGetMicroseconds();
    pRVar31[lVar30].timeBeforeUse = dVar16 - pSVar3[lVar26].uploadCallEndTime;
    dVar16 = deGetMicroseconds();
    if (this->m_drawMethod == DRAWMETHOD_DRAW_ELEMENTS) {
      (**(code **)(lVar21 + 0x568))(4,this->m_numVertices,0x1405,0);
    }
    else if (this->m_drawMethod == DRAWMETHOD_DRAW_ARRAYS) {
      (**(code **)(lVar21 + 0x538))(4,0,this->m_numVertices);
    }
    dVar17 = deGetMicroseconds();
    pRVar31[lVar30].renderDuration = dVar17 - dVar16;
    dVar16 = deGetMicroseconds();
    context = ((this->super_RenderPerformanceTestBase).super_TestCase.m_context)->m_renderCtx;
    tcu::Surface::getAccess((PixelBufferAccess *)local_6d0,&resultSurface);
    glu::readPixels(context,0,0,(PixelBufferAccess *)local_6d0);
    dVar17 = deGetMicroseconds();
    pRVar31[lVar30].readDuration = dVar17 - dVar16;
    pRVar31[lVar30].renderReadDuration = (dVar17 - dVar16) + pRVar31[lVar30].renderDuration;
    tcu::Surface::~Surface(&resultSurface);
    if (this->m_bufferState == BUFFERSTATE_NEW) {
      iVar11 = (*((this->super_RenderPerformanceTestBase).super_TestCase.m_context)->m_renderCtx->
                 _vptr_RenderContext[3])();
      lVar26 = CONCAT44(extraout_var_03,iVar11);
      if (this->m_targetBuffer == TARGETBUFFER_VERTEX) {
        if ((Performance::(anonymous_namespace)::UploadWaitDrawCase::reuseAndDeleteBuffer()::
             coloredTriangle == '\0') &&
           (iVar11 = __cxa_guard_acquire(&Performance::(anonymous_namespace)::UploadWaitDrawCase::
                                          reuseAndDeleteBuffer()::coloredTriangle), iVar11 != 0)) {
          Performance::(anonymous_namespace)::UploadWaitDrawCase::reuseAndDeleteBuffer()::
          coloredTriangle._0_8_ = 0x3f800000;
          Performance::(anonymous_namespace)::UploadWaitDrawCase::reuseAndDeleteBuffer()::
          coloredTriangle._8_8_ = 0x3f80000000000000;
          Performance::(anonymous_namespace)::UploadWaitDrawCase::reuseAndDeleteBuffer()::
          coloredTriangle._16_8_ = 0xbecccccdbecccccd;
          Performance::(anonymous_namespace)::UploadWaitDrawCase::reuseAndDeleteBuffer()::
          coloredTriangle._24_8_ = 0x3f80000000000000;
          Performance::(anonymous_namespace)::UploadWaitDrawCase::reuseAndDeleteBuffer()::
          coloredTriangle._32_8_ = 0x3f800000;
          Performance::(anonymous_namespace)::UploadWaitDrawCase::reuseAndDeleteBuffer()::
          coloredTriangle._40_8_ = 0x3f80000000000000;
          Performance::(anonymous_namespace)::UploadWaitDrawCase::reuseAndDeleteBuffer()::
          coloredTriangle._48_4_ = 0xbe4ccccd;
          Performance::(anonymous_namespace)::UploadWaitDrawCase::reuseAndDeleteBuffer()::
          coloredTriangle._52_4_ = 0x3ecccccd;
          Performance::(anonymous_namespace)::UploadWaitDrawCase::reuseAndDeleteBuffer()::
          coloredTriangle._56_4_ = 0;
          Performance::(anonymous_namespace)::UploadWaitDrawCase::reuseAndDeleteBuffer()::
          coloredTriangle._60_4_ = 0x3f800000;
          Performance::(anonymous_namespace)::UploadWaitDrawCase::reuseAndDeleteBuffer()::
          coloredTriangle._64_8_ = 0x3f800000;
          Performance::(anonymous_namespace)::UploadWaitDrawCase::reuseAndDeleteBuffer()::
          coloredTriangle._72_8_ = 0x3f80000000000000;
          Performance::(anonymous_namespace)::UploadWaitDrawCase::reuseAndDeleteBuffer()::
          coloredTriangle._80_4_ = 0x3f4ccccd;
          Performance::(anonymous_namespace)::UploadWaitDrawCase::reuseAndDeleteBuffer()::
          coloredTriangle._84_4_ = 0xbdcccccd;
          Performance::(anonymous_namespace)::UploadWaitDrawCase::reuseAndDeleteBuffer()::
          coloredTriangle._88_4_ = 0;
          Performance::(anonymous_namespace)::UploadWaitDrawCase::reuseAndDeleteBuffer()::
          coloredTriangle._92_4_ = 0x3f800000;
          __cxa_guard_release(&Performance::(anonymous_namespace)::UploadWaitDrawCase::
                               reuseAndDeleteBuffer()::coloredTriangle);
        }
        (**(code **)(lVar26 + 0x150))
                  (0x8892,0x60,
                   Performance::(anonymous_namespace)::UploadWaitDrawCase::reuseAndDeleteBuffer()::
                   coloredTriangle,0x88e4);
        (**(code **)(lVar26 + 0x538))(4,0,3);
        (**(code **)(lVar26 + 0x438))(1,&this->m_vertexBuffer);
        this->m_vertexBuffer = 0;
      }
      else if (this->m_targetBuffer == TARGETBUFFER_INDEX) {
        (**(code **)(lVar26 + 0x150))
                  (0x8893,0xc,
                   Performance::(anonymous_namespace)::UploadWaitDrawCase::reuseAndDeleteBuffer()::
                   indices,0x88e4);
        (**(code **)(lVar26 + 0x568))(4,3,0x1405,0);
        (**(code **)(lVar26 + 0x438))(1,&this->m_indexBuffer);
        this->m_indexBuffer = 0;
      }
      RenderPerformanceTestBase::waitGLResults(&this->super_RenderPerformanceTestBase);
    }
  }
  else if (iVar11 == iVar12 + 5) {
    this->m_sampleNdx = this->m_sampleNdx + 1;
    this->m_frameNdx = 0;
  }
  dVar13 = (**(code **)(local_848 + 0x800))();
  glu::checkError(dVar13,"post-iterate",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/performance/es3pBufferDataUploadTests.cpp"
                  ,0x1631);
  if (this->m_sampleNdx <
      (int)((ulong)((long)(this->m_samples).
                          super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->m_samples).
                         super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 4)) {
    IVar15 = CONTINUE;
  }
  else {
    pTVar4 = ((this->super_RenderPerformanceTestBase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx)->m_log;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_6d0,"Samples",(allocator<char> *)&section_1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&resultSurface,"Result samples",(allocator<char> *)&local_738);
    tcu::ScopedLogSection::ScopedLogSection
              (&section,pTVar4,(string *)local_6d0,(string *)&resultSurface);
    std::__cxx11::string::~string((string *)&resultSurface);
    std::__cxx11::string::~string((string *)local_6d0);
    std::vector<int,_std::allocator<int>_>::vector
              (&runOrder,
               (long)(this->m_iterationOrder).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(this->m_iterationOrder).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2,(allocator_type *)local_6d0);
    piVar5 = (this->m_iterationOrder).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar22 = (ulong)((long)(this->m_iterationOrder).super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_finish - (long)piVar5) >> 2;
    uVar27 = 0;
    __n = uVar22 & 0xffffffff;
    if ((int)uVar22 < 1) {
      __n = uVar27;
    }
    for (; __n != uVar27; uVar27 = uVar27 + 1) {
      runOrder.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[piVar5[uVar27]] = (int)uVar27;
    }
    pTVar4 = ((this->super_RenderPerformanceTestBase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx)->m_log;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_230,"Samples",&local_851);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_250,"Samples",&local_852);
    tcu::LogSampleList::LogSampleList(&local_70,&local_230,&local_250);
    iVar11 = (int)pTVar4;
    tcu::LogSampleList::write(&local_70,iVar11,__buf,__n);
    tcu::TestLog::startSampleInfo(pTVar4);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_270,"NumSwaps",&local_853);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_290,"SwapBuffers before use",&local_854);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2b0,glcts::fixed_sample_locations_values + 1,&local_855);
    psVar23 = &local_2b0;
    tcu::LogValueInfo::LogValueInfo
              ((LogValueInfo *)local_6d0,&local_270,&local_290,psVar23,QP_SAMPLE_VALUE_TAG_PREDICTOR
              );
    tcu::LogValueInfo::write((LogValueInfo *)local_6d0,iVar11,__buf_00,(size_t)psVar23);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d0,"Delay",&local_856);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2f0,"Time before use",&local_857);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_310,"us",&local_858);
    psVar23 = &local_310;
    tcu::LogValueInfo::LogValueInfo
              ((LogValueInfo *)&resultSurface,&local_2d0,&local_2f0,psVar23,
               QP_SAMPLE_VALUE_TAG_PREDICTOR);
    tcu::LogValueInfo::write((LogValueInfo *)&resultSurface,iVar11,__buf_01,(size_t)psVar23);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_330,"RunOrder",&local_859);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_350,"Sample run order",&local_85a);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_370,glcts::fixed_sample_locations_values + 1,&local_85b);
    psVar23 = &local_370;
    tcu::LogValueInfo::LogValueInfo
              ((LogValueInfo *)&section_1,&local_330,&local_350,psVar23,
               QP_SAMPLE_VALUE_TAG_PREDICTOR);
    tcu::LogValueInfo::write((LogValueInfo *)&section_1,iVar11,__buf_02,(size_t)psVar23);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_390,"DrawReadTime",&local_85c);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3b0,"Draw call and ReadPixels time",&local_85d);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3d0,"us",&local_85e);
    psVar23 = &local_3d0;
    tcu::LogValueInfo::LogValueInfo
              (&local_738,&local_390,&local_3b0,psVar23,QP_SAMPLE_VALUE_TAG_RESPONSE);
    tcu::LogValueInfo::write(&local_738,iVar11,__buf_03,(size_t)psVar23);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3f0,"TotalTime",&local_85f);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_410,"Total time",&local_860)
    ;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_430,"us",&local_861);
    psVar23 = &local_430;
    tcu::LogValueInfo::LogValueInfo
              ((LogValueInfo *)&section_2,&local_3f0,&local_410,psVar23,QP_SAMPLE_VALUE_TAG_RESPONSE
              );
    tcu::LogValueInfo::write((LogValueInfo *)&section_2,iVar11,__buf_04,(size_t)psVar23);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_450,"Upload time",&local_862);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_470,"Upload time",&local_863);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_490,"us",&local_864);
    psVar23 = &local_490;
    tcu::LogValueInfo::LogValueInfo
              (&local_d8,&local_450,&local_470,psVar23,QP_SAMPLE_VALUE_TAG_RESPONSE);
    tcu::LogValueInfo::write(&local_d8,iVar11,__buf_05,(size_t)psVar23);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4b0,"DrawCallTime",&local_865);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4d0,"Draw call time",&local_866);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_4f0,"us",&local_867);
    psVar23 = &local_4f0;
    tcu::LogValueInfo::LogValueInfo
              (&local_140,&local_4b0,&local_4d0,psVar23,QP_SAMPLE_VALUE_TAG_RESPONSE);
    tcu::LogValueInfo::write(&local_140,iVar11,__buf_06,(size_t)psVar23);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_510,"ReadTime",&local_868);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_530,"ReadPixels time",&local_869);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_550,"us",&local_86a);
    psVar23 = &local_550;
    tcu::LogValueInfo::LogValueInfo
              (&local_1a8,&local_510,&local_530,psVar23,QP_SAMPLE_VALUE_TAG_RESPONSE);
    tcu::LogValueInfo::write(&local_1a8,iVar11,__buf_07,(size_t)psVar23);
    tcu::TestLog::endSampleInfo(pTVar4);
    tcu::LogValueInfo::~LogValueInfo(&local_1a8);
    std::__cxx11::string::~string((string *)&local_550);
    std::__cxx11::string::~string((string *)&local_530);
    std::__cxx11::string::~string((string *)&local_510);
    tcu::LogValueInfo::~LogValueInfo(&local_140);
    std::__cxx11::string::~string((string *)&local_4f0);
    std::__cxx11::string::~string((string *)&local_4d0);
    std::__cxx11::string::~string((string *)&local_4b0);
    tcu::LogValueInfo::~LogValueInfo(&local_d8);
    std::__cxx11::string::~string((string *)&local_490);
    std::__cxx11::string::~string((string *)&local_470);
    std::__cxx11::string::~string((string *)&local_450);
    tcu::LogValueInfo::~LogValueInfo((LogValueInfo *)&section_2);
    std::__cxx11::string::~string((string *)&local_430);
    std::__cxx11::string::~string((string *)&local_410);
    std::__cxx11::string::~string((string *)&local_3f0);
    tcu::LogValueInfo::~LogValueInfo(&local_738);
    std::__cxx11::string::~string((string *)&local_3d0);
    std::__cxx11::string::~string((string *)&local_3b0);
    std::__cxx11::string::~string((string *)&local_390);
    tcu::LogValueInfo::~LogValueInfo((LogValueInfo *)&section_1);
    std::__cxx11::string::~string((string *)&local_370);
    std::__cxx11::string::~string((string *)&local_350);
    std::__cxx11::string::~string((string *)&local_330);
    tcu::LogValueInfo::~LogValueInfo((LogValueInfo *)&resultSurface);
    std::__cxx11::string::~string((string *)&local_310);
    std::__cxx11::string::~string((string *)&local_2f0);
    std::__cxx11::string::~string((string *)&local_2d0);
    tcu::LogValueInfo::~LogValueInfo((LogValueInfo *)local_6d0);
    std::__cxx11::string::~string((string *)&local_2b0);
    std::__cxx11::string::~string((string *)&local_290);
    std::__cxx11::string::~string((string *)&local_270);
    tcu::LogSampleList::~LogSampleList(&local_70);
    std::__cxx11::string::~string((string *)&local_250);
    std::__cxx11::string::~string((string *)&local_230);
    lVar30 = 0;
    lVar26 = 0;
    for (lVar21 = 0;
        pSVar3 = (this->m_samples).
                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        lVar21 < (int)((ulong)((long)(this->m_samples).
                                     super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar3) >> 4
                      ); lVar21 = lVar21 + 1) {
      local_6d0 = (undefined1  [8])
                  ((this->super_RenderPerformanceTestBase).super_TestCase.super_TestCase.
                   super_TestNode.m_testCtx)->m_log;
      local_6c8._0_8_ = (pointer)0x0;
      local_6c8._8_8_ = 0;
      local_6c8._16_4_ = 0;
      local_6c8._20_4_ = 0;
      pSVar19 = tcu::SampleBuilder::operator<<
                          ((SampleBuilder *)local_6d0,(&pSVar3->numFrames)[lVar30]);
      pSVar19 = tcu::SampleBuilder::operator<<
                          (pSVar19,*(int *)((long)&((this->m_results).
                                                                                                        
                                                  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Result,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Result>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  timeBeforeUse + lVar26));
      pSVar19 = tcu::SampleBuilder::operator<<
                          (pSVar19,*(int *)((long)runOrder.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start + lVar30)
                          );
      pSVar19 = tcu::SampleBuilder::operator<<
                          (pSVar19,*(int *)((long)&((this->m_results).
                                                                                                        
                                                  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Result,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Result>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  renderReadDuration + lVar26));
      pRVar31 = (this->m_results).
                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Result,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Result>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pSVar19 = tcu::SampleBuilder::operator<<
                          (pSVar19,*(int *)((long)&pRVar31->uploadDuration + lVar26) +
                                   *(int *)((long)&pRVar31->renderReadDuration + lVar26));
      pSVar19 = tcu::SampleBuilder::operator<<
                          (pSVar19,*(int *)((long)&((this->m_results).
                                                                                                        
                                                  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Result,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Result>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  uploadDuration + lVar26));
      pSVar19 = tcu::SampleBuilder::operator<<
                          (pSVar19,*(int *)((long)&((this->m_results).
                                                                                                        
                                                  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Result,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Result>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  renderDuration + lVar26));
      pSVar19 = tcu::SampleBuilder::operator<<
                          (pSVar19,*(int *)((long)&((this->m_results).
                                                                                                        
                                                  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Result,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Result>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  readDuration + lVar26));
      tcu::SampleBuilder::operator<<(pSVar19,(EndSampleToken *)&tcu::TestLog::EndSample);
      std::_Vector_base<tcu::SampleBuilder::Value,_std::allocator<tcu::SampleBuilder::Value>_>::
      ~_Vector_base((_Vector_base<tcu::SampleBuilder::Value,_std::allocator<tcu::SampleBuilder::Value>_>
                     *)local_6c8);
      lVar26 = lVar26 + 0x28;
      lVar30 = lVar30 + 4;
    }
    tcu::TestLog::endSampleList
              (((this->super_RenderPerformanceTestBase).super_TestCase.super_TestCase.super_TestNode
               .m_testCtx)->m_log);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&runOrder.super__Vector_base<int,_std::allocator<int>_>);
    tcu::ScopedLogSection::~ScopedLogSection(&section);
    pTVar4 = ((this->super_RenderPerformanceTestBase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx)->m_log;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_6d0,"Stabilization",(allocator<char> *)&local_738);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&resultSurface,"Sample stability",(allocator<char> *)&section_2);
    tcu::ScopedLogSection::ScopedLogSection
              (&section_1,pTVar4,(string *)local_6d0,(string *)&resultSurface);
    std::__cxx11::string::~string((string *)&resultSurface);
    std::__cxx11::string::~string((string *)local_6d0);
    iVar11 = findStabilizationSample(this,0x18,"Combined draw and read");
    renderReadStabilization = iVar11;
    iVar12 = findStabilizationSample(this,0,"Upload time");
    iVar14 = findStabilizationSample(this,8,"Draw call time");
    local_850 = CONCAT44(local_850._4_4_,iVar14);
    iVar14 = findStabilizationSample(this,0x10,"ReadPixels time");
    local_848 = CONCAT44(local_848._4_4_,iVar14);
    bVar7 = checkSampleTemporalStability(this,0x18,"Combined draw and read");
    bVar8 = checkSampleTemporalStability(this,0,"Upload time");
    bVar9 = checkSampleTemporalStability(this,8,"Draw call time");
    bVar10 = checkSampleTemporalStability(this,0x10,"ReadPixels time");
    tcu::ScopedLogSection::~ScopedLogSection(&section_1);
    pTVar4 = ((this->super_RenderPerformanceTestBase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx)->m_log;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_6d0,"Results",(allocator<char> *)&section_1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&resultSurface,"Results",(allocator<char> *)&local_738);
    tcu::ScopedLogSection::ScopedLogSection
              (&section_2,pTVar4,(string *)local_6d0,(string *)&resultSurface);
    std::__cxx11::string::~string((string *)&resultSurface);
    std::__cxx11::string::~string((string *)local_6d0);
    if (iVar12 != 0) {
      local_6d0 = (undefined1  [8])
                  ((this->super_RenderPerformanceTestBase).super_TestCase.super_TestCase.
                   super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6c8);
      std::operator<<((ostream *)local_6c8,
                      "Warning! Upload times are not stable, test result may not be accurate.");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_6d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_6c8);
    }
    if ((!bVar9 || !bVar10) || (!bVar7 || !bVar8)) {
      local_6d0 = (undefined1  [8])
                  ((this->super_RenderPerformanceTestBase).super_TestCase.super_TestCase.
                   super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6c8);
      std::operator<<((ostream *)local_6c8,
                      "Warning! Time samples do not seem to be temporally stable, sample times seem to drift to one direction during test execution."
                     );
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_6d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_6c8);
    }
    if (iVar11 == -1) {
      local_6d0 = (undefined1  [8])
                  ((this->super_RenderPerformanceTestBase).super_TestCase.super_TestCase.
                   super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6c8);
      std::operator<<((ostream *)local_6c8,
                      "Combined time used in draw call and ReadPixels did not stabilize.");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_6d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_6c8);
    }
    else {
      pTVar4 = ((this->super_RenderPerformanceTestBase).super_TestCase.super_TestCase.super_TestNode
               .m_testCtx)->m_log;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&resultSurface,"RenderReadStabilizationPoint",
                 (allocator<char> *)&local_d8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&section_1,
                 "Combined draw call and ReadPixels call time stabilization time",
                 (allocator<char> *)&local_140);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_738,"frames",(allocator<char> *)&local_1a8);
      pLVar24 = &local_738;
      tcu::LogNumber<long>::LogNumber
                ((LogNumber<long> *)local_6d0,(string *)&resultSurface,(string *)&section_1,
                 &pLVar24->m_name,QP_KEY_TAG_TIME,(long)iVar11);
      tcu::LogNumber<long>::write((LogNumber<long> *)local_6d0,(int)pTVar4,__buf_08,(size_t)pLVar24)
      ;
      tcu::LogNumber<long>::~LogNumber((LogNumber<long> *)local_6d0);
      std::__cxx11::string::~string((string *)&local_738);
      std::__cxx11::string::~string((string *)&section_1);
      std::__cxx11::string::~string((string *)&resultSurface);
    }
    if ((int)local_850 == -1) {
      local_6d0 = (undefined1  [8])
                  ((this->super_RenderPerformanceTestBase).super_TestCase.super_TestCase.
                   super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6c8);
      std::operator<<((ostream *)local_6c8,"Time used in draw call did not stabilize.");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_6d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_6c8);
    }
    else {
      pTVar4 = ((this->super_RenderPerformanceTestBase).super_TestCase.super_TestCase.super_TestNode
               .m_testCtx)->m_log;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&resultSurface,"DrawCallStabilizationPoint",(allocator<char> *)&local_d8)
      ;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&section_1,"Draw call time stabilization time",
                 (allocator<char> *)&local_140);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_738,"frames",(allocator<char> *)&local_1a8);
      pLVar24 = &local_738;
      tcu::LogNumber<long>::LogNumber
                ((LogNumber<long> *)local_6d0,(string *)&resultSurface,(string *)&section_1,
                 &pLVar24->m_name,QP_KEY_TAG_TIME,(long)(int)local_850);
      tcu::LogNumber<long>::write((LogNumber<long> *)local_6d0,(int)pTVar4,__buf_09,(size_t)pLVar24)
      ;
      tcu::LogNumber<long>::~LogNumber((LogNumber<long> *)local_6d0);
      std::__cxx11::string::~string((string *)&local_738);
      std::__cxx11::string::~string((string *)&section_1);
      std::__cxx11::string::~string((string *)&resultSurface);
    }
    if ((int)local_848 == -1) {
      local_6d0 = (undefined1  [8])
                  ((this->super_RenderPerformanceTestBase).super_TestCase.super_TestCase.
                   super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6c8);
      std::operator<<((ostream *)local_6c8,"Time used in ReadPixels did not stabilize.");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_6d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_6c8);
    }
    else {
      pTVar4 = ((this->super_RenderPerformanceTestBase).super_TestCase.super_TestCase.super_TestNode
               .m_testCtx)->m_log;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&resultSurface,"ReadPixelsStabilizationPoint",
                 (allocator<char> *)&local_d8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&section_1,"ReadPixels call time stabilization time",
                 (allocator<char> *)&local_140);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_738,"frames",(allocator<char> *)&local_1a8);
      pLVar24 = &local_738;
      tcu::LogNumber<long>::LogNumber
                ((LogNumber<long> *)local_6d0,(string *)&resultSurface,(string *)&section_1,
                 &pLVar24->m_name,QP_KEY_TAG_TIME,(long)(int)local_848);
      tcu::LogNumber<long>::write((LogNumber<long> *)local_6d0,(int)pTVar4,__buf_10,(size_t)pLVar24)
      ;
      tcu::LogNumber<long>::~LogNumber((LogNumber<long> *)local_6d0);
      std::__cxx11::string::~string((string *)&local_738);
      std::__cxx11::string::~string((string *)&section_1);
      std::__cxx11::string::~string((string *)&resultSurface);
    }
    this_00 = (this->super_RenderPerformanceTestBase).super_TestCase.super_TestCase.super_TestNode.
              m_testCtx;
    if (iVar11 == -1) {
      de::toString<int>((string *)local_6d0,&this->m_numMaxSwaps);
      tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_PASS,(char *)local_6d0);
    }
    else {
      de::toString<int>((string *)local_6d0,&renderReadStabilization);
      tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_PASS,(char *)local_6d0);
    }
    std::__cxx11::string::~string((string *)local_6d0);
    tcu::ScopedLogSection::~ScopedLogSection(&section_2);
    IVar15 = STOP;
  }
  return IVar15;
}

Assistant:

UploadWaitDrawCase::IterateResult UploadWaitDrawCase::iterate (void)
{
	const glw::Functions&	gl								= m_context.getRenderContext().getFunctions();
	const int				betweenIterationDummyFrameCount = 5; // draw misc between test samples
	const int				frameNdx						= m_frameNdx++;
	const int				currentSampleNdx				= m_iterationOrder[m_sampleNdx];

	// Simulate work for about 8ms
	busyWait(8000);

	// Dummy rendering during dummy frames
	if (frameNdx != m_samples[currentSampleNdx].numFrames)
	{
		// draw similar from another buffer
		drawMisc();
	}

	if (frameNdx == 0)
	{
		// upload and start the clock
		uploadBuffer(m_samples[currentSampleNdx], m_results[currentSampleNdx]);
	}

	if (frameNdx == m_samples[currentSampleNdx].numFrames) // \note: not else if, m_samples[currentSampleNdx].numFrames can be 0
	{
		// draw using the uploaded buffer
		drawFromBuffer(m_samples[currentSampleNdx], m_results[currentSampleNdx]);

		// re-use buffer for something else to make sure test iteration do not affect each other
		if (m_bufferState == BUFFERSTATE_NEW)
			reuseAndDeleteBuffer();
	}
	else if (frameNdx == m_samples[currentSampleNdx].numFrames + betweenIterationDummyFrameCount)
	{
		// next sample
		++m_sampleNdx;
		m_frameNdx = 0;
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "post-iterate");

	if (m_sampleNdx < (int)m_samples.size())
		return CONTINUE;

	logAndSetTestResult();
	return STOP;
}